

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O0

double openjtalk_getBeta(OpenJTalk *oj)

{
  long in_RDI;
  double dVar1;
  double res;
  _Bool error;
  Open_JTalk *in_stack_ffffffffffffffd8;
  undefined1 local_11;
  undefined8 local_8;
  
  if (in_RDI == 0) {
    g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
    local_8 = 0.0;
  }
  else {
    *(undefined4 *)(in_RDI + 0x678) = 0;
    dVar1 = Open_JTalk_get_beta(in_stack_ffffffffffffffd8,(_Bool *)0x19a9ba);
    if ((local_11 & 1) == 0) {
      *(double *)(in_RDI + 0x650) = dVar1;
      local_8 = *(double *)(in_RDI + 0x650);
    }
    else {
      *(undefined4 *)(in_RDI + 0x678) = 1;
      local_8 = 0.0;
    }
  }
  return local_8;
}

Assistant:

OPENJTALK_CONVENTION openjtalk_getBeta(OpenJTalk *oj)
{
	if (!oj)
	{
		g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
		return 0.0;
	}

	oj->errorCode = OPENJTALKERROR_NO_ERROR;
	bool error;
	double res = Open_JTalk_get_beta(oj->open_jtalk, &error);
	if (error)
	{
		oj->errorCode = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
		return 0.0;
	}
	oj->beta = res;
	return oj->beta;
}